

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGame.cpp
# Opt level: O1

void __thiscall
BayesianGame::BayesianGame
          (BayesianGame *this,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes)

{
  size_t nrS;
  size_t nrJA;
  bool bVar1;
  ulong uVar2;
  RewardModelMapping r;
  string local_f0;
  string local_d0;
  RewardModelMapping local_b0;
  
  BayesianGameBase::BayesianGameBase(&this->super_BayesianGameBase,nrAgents,nrActions,nrTypes,0);
  (this->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGame_005a1238;
  (this->_m_utilFuncs).super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_utilFuncs).super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_utilFuncs).super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nrS = (this->super_BayesianGameBase)._m_nrJTypes;
  nrJA = (this->super_BayesianGameBase)._m_nrJA;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"type","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"ja","");
  RewardModelMapping::RewardModelMapping(&local_b0,nrS,nrJA,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_BayesianGameBase)._m_nrAgents != 0) {
    uVar2 = 1;
    do {
      std::vector<RewardModelMapping,_std::allocator<RewardModelMapping>_>::push_back
                (&this->_m_utilFuncs,&local_b0);
      bVar1 = uVar2 < (this->super_BayesianGameBase)._m_nrAgents;
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (bVar1);
  }
  RewardModelMapping::~RewardModelMapping(&local_b0);
  return;
}

Assistant:

BayesianGame::BayesianGame(size_t nrAgents, const vector<size_t> &nrActions,  
                           const vector<size_t> &nrTypes) :
    BayesianGameBase(nrAgents, nrActions, nrTypes)
{
    //initialize the utility functions
    RewardModelMapping r(_m_nrJTypes, _m_nrJA, "type", "ja");
    for(Index i = 0; i < _m_nrAgents; i++)
        _m_utilFuncs.push_back(r); //r is copied by value so we get independent
        //copies in _m_utilFuncs.

}